

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  uint uVar1;
  bool bVar2;
  Message *this_00;
  uint uVar3;
  bool bVar4;
  undefined1 local_1f8 [8];
  ostringstream stream;
  string local_80;
  undefined1 local_60 [8];
  string error_message;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  
  if (this->spawned_ != true) {
    return false;
  }
  (*(this->super_DeathTest)._vptr_DeathTest[6])(local_60,this);
  Message::Message((Message *)&local_20);
  std::operator<<((ostream *)(local_20._M_head_impl + 0x10),"Death test: ");
  local_1f8 = (undefined1  [8])this->statement_;
  this_00 = Message::operator<<((Message *)&local_20,(char **)local_1f8);
  Message::operator<<(this_00,(char (*) [2])0x12f96b);
  switch(this->outcome_) {
  case DIED:
    if (!status_ok) {
      std::operator<<((ostream *)(local_20._M_head_impl + 0x10),
                      "    Result: died but not with expected exit code:\n");
      std::operator<<((ostream *)(local_20._M_head_impl + 0x10),"            ");
      uVar1 = this->status_;
      Message::Message((Message *)((long)&error_message.field_2 + 8));
      uVar3 = uVar1 & 0x7f;
      if (uVar3 == 0) {
        std::operator<<((ostream *)(error_message.field_2._8_8_ + 0x10),"Exited with exit status ");
        std::ostream::operator<<((void *)(error_message.field_2._8_8_ + 0x10),uVar1 >> 8 & 0xff);
      }
      else if (0x1ffffff < (int)(uVar3 * 0x1000000 + 0x1000000)) {
        std::operator<<((ostream *)(error_message.field_2._8_8_ + 0x10),"Terminated by signal ");
        std::ostream::operator<<((void *)(error_message.field_2._8_8_ + 0x10),uVar3);
      }
      if ((char)uVar1 < '\0') {
        std::operator<<((ostream *)(error_message.field_2._8_8_ + 0x10)," (core dumped)");
      }
      Message::GetString_abi_cxx11_
                ((string *)local_1f8,(Message *)((long)&error_message.field_2 + 8));
      if (error_message.field_2._8_8_ != 0) {
        (**(code **)(*(long *)error_message.field_2._8_8_ + 8))();
      }
      std::operator<<((ostream *)(local_20._M_head_impl + 0x10),(string *)local_1f8);
      std::operator<<((ostream *)(local_20._M_head_impl + 0x10),"\n");
      std::operator<<((ostream *)(local_20._M_head_impl + 0x10),"Actual msg:\n");
      FormatDeathTestOutput((string *)((long)&error_message.field_2 + 8),(string *)local_60);
      std::operator<<((ostream *)(local_20._M_head_impl + 0x10),
                      (string *)(error_message.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(error_message.field_2._M_local_buf + 8));
      break;
    }
    bVar2 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            ::Matches(&(this->matcher_).
                       super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                     );
    bVar4 = true;
    if (bVar2) goto LAB_001295b4;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::DescribeTo(&(this->matcher_).
                  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 ,(ostream *)local_1f8);
    std::operator<<((ostream *)(local_20._M_head_impl + 0x10),
                    "    Result: died but not with expected error.\n");
    std::operator<<((ostream *)(local_20._M_head_impl + 0x10),"  Expected: ");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)(local_20._M_head_impl + 0x10),
                    (string *)(error_message.field_2._M_local_buf + 8));
    std::operator<<((ostream *)(local_20._M_head_impl + 0x10),"\n");
    std::operator<<((ostream *)(local_20._M_head_impl + 0x10),"Actual msg:\n");
    FormatDeathTestOutput(&local_80,(string *)local_60);
    std::operator<<((ostream *)(local_20._M_head_impl + 0x10),(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)(error_message.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
    goto LAB_001295b1;
  case LIVED:
    std::operator<<((ostream *)(local_20._M_head_impl + 0x10),"    Result: failed to die.\n");
    std::operator<<((ostream *)(local_20._M_head_impl + 0x10)," Error msg:\n");
    FormatDeathTestOutput((string *)local_1f8,(string *)local_60);
    std::operator<<((ostream *)(local_20._M_head_impl + 0x10),(string *)local_1f8);
    break;
  case RETURNED:
    std::operator<<((ostream *)(local_20._M_head_impl + 0x10),
                    "    Result: illegal return in test statement.\n");
    std::operator<<((ostream *)(local_20._M_head_impl + 0x10)," Error msg:\n");
    FormatDeathTestOutput((string *)local_1f8,(string *)local_60);
    std::operator<<((ostream *)(local_20._M_head_impl + 0x10),(string *)local_1f8);
    break;
  case THREW:
    std::operator<<((ostream *)(local_20._M_head_impl + 0x10),"    Result: threw an exception.\n");
    std::operator<<((ostream *)(local_20._M_head_impl + 0x10)," Error msg:\n");
    FormatDeathTestOutput((string *)local_1f8,(string *)local_60);
    std::operator<<((ostream *)(local_20._M_head_impl + 0x10),(string *)local_1f8);
    break;
  default:
    GTestLog::GTestLog((GTestLog *)local_1f8,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                       ,0x26e);
    std::operator<<((ostream *)&std::cerr,
                    "DeathTest::Passed somehow called before conclusion of test");
    GTestLog::~GTestLog((GTestLog *)local_1f8);
    goto LAB_001295b1;
  }
  std::__cxx11::string::~string((string *)local_1f8);
LAB_001295b1:
  bVar4 = false;
LAB_001295b4:
  Message::GetString_abi_cxx11_((string *)local_1f8,(Message *)&local_20);
  DeathTest::set_last_death_test_message((string *)local_1f8);
  std::__cxx11::string::~string((string *)local_1f8);
  if (local_20._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_20._M_head_impl + 8))();
  }
  std::__cxx11::string::~string((string *)local_60);
  return bVar4;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned()) return false;

  const std::string error_message = GetErrorLogs();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n"
             << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n"
             << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n"
             << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        if (matcher_.Matches(error_message)) {
          success = true;
        } else {
          std::ostringstream stream;
          matcher_.DescribeTo(&stream);
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << stream.str() << "\n"
                 << "Actual msg:\n"
                 << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n"
               << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}